

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzSubWMod(word *b,word *a,word w,word *mod,size_t n)

{
  word wVar1;
  word *in_RCX;
  word in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t in_R8;
  word mask;
  
  wVar1 = zzSubW(in_RDI,in_RSI,in_R8,in_RDX);
  zzAddAndW(in_RDI,in_RCX,in_R8,-wVar1);
  return;
}

Assistant:

void SAFE(zzSubWMod)(word b[], const word a[], register word w, 
	 const word mod[], size_t n)
{
	register word mask;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// mask <- a < w ? WORD_MAX : WORD_0
	mask = WORD_0 - zzSubW(b, a, n, w);
	zzAddAndW(b, mod,  n, mask);
	w = mask = 0;
}